

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::sprint(VM *this)

{
  int iVar1;
  char cVar2;
  undefined8 in_RAX;
  slot_t *psVar3;
  addr_t addr;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ensureStackUsed(this,1);
  iVar1 = this->_sp;
  this->_sp = iVar1 + -1;
  addr = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar1 + -1];
  psVar3 = checkAddr(this,addr,1);
  cVar2 = (char)*psVar3;
  if (cVar2 != '\0') {
    do {
      addr = addr + 1;
      uStack_28 = CONCAT17(cVar2,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
      psVar3 = checkAddr(this,addr,1);
      cVar2 = (char)*psVar3;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void VM::sprint() {
    auto str = POP<addr_t>();
    // std::cout << reinterpret_cast<const char*>(str);
    char_t ch;
    while ((ch = READ<char_t>(str++)) != '\0') {
        std::cout << ch;
    }
}